

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedAC3TrackData::extractData(ParsedAC3TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  uint16_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *local_30;
  uint8_t *dst;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  ParsedAC3TrackData *this_local;
  
  if ((((this->m_firstPacket & 1U) != 0) && (2 < size)) && (uVar1 = AV_RB16(buff), uVar1 != 0xb77))
  {
    this->m_shortHeaderMode = true;
  }
  this->m_firstPacket = false;
  iVar2 = 0;
  if ((this->m_shortHeaderMode & 1U) != 0) {
    iVar2 = 2;
  }
  pkt->size = size + iVar2;
  puVar3 = (uint8_t *)operator_new__((long)pkt->size);
  pkt->data = puVar3;
  local_30 = pkt->data;
  if ((this->m_shortHeaderMode & 1U) != 0) {
    puVar3 = local_30 + 1;
    *local_30 = '\v';
    local_30 = local_30 + 2;
    *puVar3 = 'w';
  }
  memcpy(local_30,buff,(long)size);
  return;
}

Assistant:

void ParsedAC3TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    if (m_firstPacket && size > 2)
    {
        if (AV_RB16(buff) != 0x0b77)
            m_shortHeaderMode = true;
    }
    m_firstPacket = false;
    pkt->size = size + (m_shortHeaderMode ? 2 : 0);
    pkt->data = new uint8_t[pkt->size];
    uint8_t* dst = pkt->data;
    if (m_shortHeaderMode)
    {
        *dst++ = 0x0b;
        *dst++ = 0x77;
    }
    memcpy(dst, buff, size);
}